

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O1

void __thiscall Assimp::Q3BSPFileParser::countLumps(Q3BSPFileParser *this)

{
  std::vector<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>::resize
            (&this->m_pModel->m_Vertices,
             (ulong)(long)(this->m_pModel->m_Lumps).
                          super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[10]->iSize / 0x2c);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->m_pModel->m_Indices,
             (ulong)(long)(this->m_pModel->m_Lumps).
                          super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xb]->iSize >> 2);
  std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>::resize
            (&this->m_pModel->m_Faces,
             (ulong)(long)(this->m_pModel->m_Lumps).
                          super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xd]->iSize / 0x68);
  std::vector<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>::
  resize(&this->m_pModel->m_Textures,
         (ulong)(long)(this->m_pModel->m_Lumps).
                      super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[1]->iSize / 0x48);
  std::vector<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>::
  resize(&this->m_pModel->m_Lightmaps,
         (ulong)(long)(this->m_pModel->m_Lumps).
                      super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[0xe]->iSize / 0xc000);
  return;
}

Assistant:

void Q3BSPFileParser::countLumps()
{
    m_pModel->m_Vertices.resize( m_pModel->m_Lumps[ kVertices ]->iSize / sizeof( sQ3BSPVertex ) );
    m_pModel->m_Indices.resize( m_pModel->m_Lumps[ kMeshVerts ]->iSize  / sizeof( int ) );
    m_pModel->m_Faces.resize( m_pModel->m_Lumps[ kFaces ]->iSize / sizeof( sQ3BSPFace ) );
    m_pModel->m_Textures.resize( m_pModel->m_Lumps[ kTextures ]->iSize / sizeof( sQ3BSPTexture ) );
    m_pModel->m_Lightmaps.resize( m_pModel->m_Lumps[ kLightmaps ]->iSize / sizeof( sQ3BSPLightmap ) );
}